

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

bool __thiscall cmCTestSVN::ExternalParser::ProcessLine(ExternalParser *this)

{
  char *pcVar1;
  bool bVar2;
  string local_28;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexExternal,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexExternal).regmatch);
  if (bVar2) {
    pcVar1 = (this->RegexExternal).regmatch.startp[1];
    if (pcVar1 == (char *)0x0) {
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_28,pcVar1,(this->RegexExternal).regmatch.endp[1]);
    }
    DoPath(this,&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,
                      CONCAT71(local_28.field_2._M_allocated_capacity._1_7_,
                               local_28.field_2._M_local_buf[0]) + 1);
    }
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexExternal.find(this->Line)) {
      this->DoPath(this->RegexExternal.match(1));
    }
    return true;
  }